

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O0

SquareMatrix3<double> * __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<OpenMD::SquareMatrix3<double>>
          (SPFForceManager *this,SquareMatrix3<double> *quantityA,SquareMatrix3<double> *quantityB)

{
  SquareMatrix<double,_3> *in_RCX;
  RealType in_RDX;
  RectMatrix<double,_3U,_3U> *in_RSI;
  SPFForceManager *in_RDI;
  RealType RVar1;
  RealType result;
  Snapshot *in_stack_fffffffffffffe58;
  SPFForceManager *this_00;
  RectMatrix<double,_3U,_3U> *m;
  RectMatrix<double,_3U,_3U> local_168;
  RectMatrix<double,_3U,_3U> local_120;
  RectMatrix<double,_3U,_3U> local_d8 [2];
  RealType local_28;
  
  m = (RectMatrix<double,_3U,_3U> *)&stack0xffffffffffffffc8;
  this_00 = in_RDI;
  Snapshot::getSPFData(in_stack_fffffffffffffe58);
  std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35855e);
  RVar1 = f_lambda(this_00,in_RDX);
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x358582);
  local_28 = RVar1;
  OpenMD::operator*((double)in_RSI,m);
  OpenMD::operator*((double)in_RSI,m);
  OpenMD::operator+(in_RSI,m);
  SquareMatrix<double,_3>::SquareMatrix
            (in_RCX,(RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffe58);
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_RCX,(SquareMatrix<double,_3> *)in_stack_fffffffffffffe58);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x358626);
  RectMatrix<double,_3U,_3U>::~RectMatrix(local_d8);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_168);
  RectMatrix<double,_3U,_3U>::~RectMatrix(&local_120);
  return (SquareMatrix3<double> *)in_RDI;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }